

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

double ipx::PrimalInfeasibility(Model *model,Vector *x)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  
  if (x->_M_size != 0) {
    dVar2 = 0.0;
    sVar1 = 0;
    do {
      dVar3 = (model->lb_)._M_data[sVar1] - x->_M_data[sVar1];
      if (dVar3 <= dVar2) {
        dVar3 = dVar2;
      }
      dVar2 = x->_M_data[sVar1] - (model->ub_)._M_data[sVar1];
      if (dVar2 <= dVar3) {
        dVar2 = dVar3;
      }
      sVar1 = sVar1 + 1;
    } while (x->_M_size != sVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

double PrimalInfeasibility(const Model& model, const Vector& x) {
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    assert(x.size() == lb.size());

    double infeas = 0.0;
    for (size_t j = 0; j < x.size(); j++) {
        infeas = std::max(infeas, lb[j]-x[j]);
        infeas = std::max(infeas, x[j]-ub[j]);
    }
    return infeas;
}